

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O0

size_t tinyusdz::LZ4Compression::DecompressFromBuffer
                 (char *compressedPtr,char *outputPtr,size_t compressedSize,size_t maxOutputSize,
                 string *err)

{
  int compressedSize_00;
  size_t dest;
  char *source;
  unsigned_long *puVar1;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  unsigned_long local_d0;
  int local_c4;
  int local_c0;
  int nDecompressed_1;
  int32_t chunkSize;
  int i;
  size_t totalDecompressed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_4c;
  ulong uStack_48;
  int nDecompressed;
  size_t consumedCompressedSize;
  string *psStack_38;
  int nChunks;
  string *err_local;
  size_t maxOutputSize_local;
  size_t compressedSize_local;
  char *outputPtr_local;
  char *compressedPtr_local;
  
  psStack_38 = err;
  err_local = (string *)maxOutputSize;
  maxOutputSize_local = compressedSize;
  compressedSize_local = (size_t)outputPtr;
  if (compressedSize < 2) {
    if (err != (string *)0x0) {
      outputPtr_local = compressedPtr;
      ::std::__cxx11::string::operator=((string *)err,"Invalid compressedSize.\n");
    }
    compressedPtr_local = (char *)0x0;
  }
  else {
    outputPtr_local = compressedPtr + 1;
    consumedCompressedSize._4_4_ = (int)*compressedPtr;
    if (consumedCompressedSize._4_4_ < 0x80) {
      uStack_48 = 1;
      if ((maxOutputSize < 0x7e000000) && (consumedCompressedSize._4_4_ != 0)) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator=((string *)err,"Corrupted LZ4 compressed data.\n");
        }
        compressedPtr_local = (char *)0x0;
      }
      else if (consumedCompressedSize._4_4_ == 0) {
        local_4c = LZ4_decompress_safe(outputPtr_local,outputPtr,(int)compressedSize + -1,
                                       (int)maxOutputSize);
        if (local_4c < 0) {
          if (psStack_38 != (string *)0x0) {
            ::std::__cxx11::to_string((string *)&totalDecompressed,local_4c);
            ::std::operator+((char *)&local_90,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Failed to decompress data, possibly corrupt? LZ4 error code: ");
            ::std::operator+(&local_70,&local_90,"\n");
            ::std::__cxx11::string::operator=((string *)psStack_38,(string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_90);
            ::std::__cxx11::string::~string((string *)&totalDecompressed);
          }
          compressedPtr_local = (char *)0x0;
        }
        else {
          compressedPtr_local = (char *)(long)local_4c;
        }
      }
      else {
        _chunkSize = (char *)0x0;
        for (nDecompressed_1 = 0; dest = compressedSize_local,
            nDecompressed_1 < consumedCompressedSize._4_4_; nDecompressed_1 = nDecompressed_1 + 1) {
          local_c0 = 0;
          if (maxOutputSize_local < uStack_48 + 4) {
            if (psStack_38 != (string *)0x0) {
              ::std::__cxx11::string::operator+=((string *)psStack_38,"Corrupted chunk data.");
            }
            return 0;
          }
          compressedSize_00 = *(int *)outputPtr_local;
          local_c0 = compressedSize_00;
          if (0x7e000000 < compressedSize_00) {
            if (psStack_38 != (string *)0x0) {
              ::std::__cxx11::string::operator+=
                        ((string *)psStack_38,"ChunkSize exceeds LZ4_MAX_INPUT_SIZE.\n");
            }
            return 0;
          }
          if (compressedSize_00 < 1) {
            if (psStack_38 != (string *)0x0) {
              ::std::__cxx11::string::operator+=((string *)psStack_38,"Invalid ChunkSize.\n");
            }
            return 0;
          }
          uStack_48 = uStack_48 + 4;
          if (maxOutputSize_local < uStack_48) {
            if (psStack_38 != (string *)0x0) {
              ::std::__cxx11::string::operator+=
                        ((string *)psStack_38,"Total chunk size exceeds input compressedSize.\n");
            }
            return 0;
          }
          source = outputPtr_local + 4;
          local_d0 = 0x7e000000;
          outputPtr_local = source;
          puVar1 = ::std::min<unsigned_long>(&local_d0,(unsigned_long *)&err_local);
          local_c4 = LZ4_decompress_safe(source,(char *)dest,compressedSize_00,(int)*puVar1);
          if (local_c4 < 1) {
            if (psStack_38 != (string *)0x0) {
              ::std::__cxx11::to_string(&local_130,local_c4);
              ::std::operator+((char *)&local_110,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Failed to decompress data, possibly corrupt? LZ4 error code: ");
              ::std::operator+(&local_f0,&local_110,"\n");
              ::std::__cxx11::string::operator=((string *)psStack_38,(string *)&local_f0);
              ::std::__cxx11::string::~string((string *)&local_f0);
              ::std::__cxx11::string::~string((string *)&local_110);
              ::std::__cxx11::string::~string((string *)&local_130);
            }
            return 0;
          }
          if (err_local < (string *)(long)local_c4) {
            if (psStack_38 != (string *)0x0) {
              ::std::__cxx11::string::operator=
                        ((string *)psStack_38,"Failed to decompress data, possibly corrupt?\n");
            }
            return 0;
          }
          outputPtr_local = outputPtr_local + local_c0;
          compressedSize_local = compressedSize_local + (long)local_c4;
          err_local = (string *)((long)err_local - (long)local_c4);
          _chunkSize = _chunkSize + local_c4;
        }
        compressedPtr_local = _chunkSize;
      }
    }
    else {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator=((string *)err,"Too many chunks in LZ4 compressed data.\n")
        ;
      }
      compressedPtr_local = (char *)0x0;
    }
  }
  return (size_t)compressedPtr_local;
}

Assistant:

size_t LZ4Compression::DecompressFromBuffer(char const *compressedPtr,
                                               char *outputPtr,
                                               size_t compressedSize,
                                               size_t maxOutputSize,
                                               std::string *err) {
  if (compressedSize <= 1) {
      if (err) {
        (*err) =
            "Invalid compressedSize.\n";
      }
    return 0;
  }

  // Check first byte for # chunks.
  int nChunks = *compressedPtr++;
  if (nChunks > 127) {
    if (err) {
      (*err) =
          "Too many chunks in LZ4 compressed data.\n";
    }
    return 0;
  }

  DCOUT("compressedSize = " << compressedSize);
  DCOUT("maxOutputSize = " << maxOutputSize);
  DCOUT("nChunks = " << nChunks);
  //std::cout << "compressedSize = " << compressedSize << "\n";
  //std::cout << "maxOutputSize = " << maxOutputSize << "\n";
  //std::cout << "nChunks = " << nChunks << "\n";

  size_t consumedCompressedSize = 1;

  if (maxOutputSize < LZ4_MAX_INPUT_SIZE) {
    // nChunks must be 0 for < LZ4_MAX_INPUT_SIZE
    if (nChunks != 0) {
      if (err) {
        (*err) = "Corrupted LZ4 compressed data.\n";
      }
      return 0;
    }
  }

  if (nChunks == 0) {
    // Just one.
    int nDecompressed = LZ4_decompress_safe(compressedPtr, outputPtr,
                                            int(compressedSize - 1), int(maxOutputSize));
    if (nDecompressed < 0) {
      if (err) {
        (*err) =
            "Failed to decompress data, possibly corrupt? "
            "LZ4 error code: " +
            std::to_string(nDecompressed) + "\n";
      }
      return 0;
    }
    return size_t(nDecompressed);
  } else {
    // Do each chunk.
    size_t totalDecompressed = 0;
    for (int i = 0; i < nChunks; ++i) {
      int32_t chunkSize = 0;
      if (consumedCompressedSize + sizeof(chunkSize) > compressedSize) {
        if (err) {
           (*err) += "Corrupted chunk data.";
        }
        return 0;
          
      }

      memcpy(&chunkSize, compressedPtr, sizeof(chunkSize));

      if (chunkSize > LZ4_MAX_INPUT_SIZE) {
        if (err) {
           (*err) += "ChunkSize exceeds LZ4_MAX_INPUT_SIZE.\n";
        }
        return 0;
      }
      if (chunkSize <= 0) {
        if (err) {
           (*err) += "Invalid ChunkSize.\n";
        }
        return 0;
      }

      DCOUT("chunk[" << i << "] size = " << chunkSize);

      //std::cout << "chunkSize = " << chunkSize << "\n";
      consumedCompressedSize += sizeof(chunkSize);
      //std::cout << "consumedCompressedSize = " << consumedCompressedSize << "\n";
      //std::cout << "compressedSize = " << compressedSize << "\n";
      if (consumedCompressedSize > compressedSize) {
        if (err) {
           (*err) += "Total chunk size exceeds input compressedSize.\n";
        }
        return 0;
      }

      compressedPtr += sizeof(chunkSize);
      int nDecompressed = LZ4_decompress_safe(
          compressedPtr, outputPtr, chunkSize,
          int(std::min<size_t>(LZ4_MAX_INPUT_SIZE, maxOutputSize)));
      if (nDecompressed <= 0) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt? "
              "LZ4 error code: " +
              std::to_string(nDecompressed) + "\n";
        }
        return 0;
      }
      //std::cout << "nDecompressed = " << nDecompressed << "\n";
      if (nDecompressed > maxOutputSize) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt?\n";
        }
        return 0;
      }
      compressedPtr += chunkSize;
      outputPtr += nDecompressed;
      maxOutputSize -= size_t(nDecompressed);
      totalDecompressed += size_t(nDecompressed);
    }
    return totalDecompressed;
  }
  // unreachable.
}